

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
basic_bson_encoder(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  binary_stream_sink *sink,bson_encode_options *options,allocator<char> *alloc)

{
  binary_stream_sink *in_RCX;
  binary_stream_sink *in_RDI;
  
  basic_json_visitor<char>::basic_json_visitor((basic_json_visitor<char> *)in_RDI);
  in_RDI->stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_bson_encoder_01334d20;
  binary_stream_sink::binary_stream_sink(in_RCX,in_RDI);
  bson_encode_options::bson_encode_options
            ((bson_encode_options *)in_RCX,(bson_encode_options *)in_RDI);
  std::allocator<char>::allocator((allocator *)&in_RDI[1].begin_buffer_);
  std::
  vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ::vector((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
            *)0x2322f7);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x232304);
  *(undefined4 *)&in_RDI[2].begin_buffer_ = 0;
  return;
}

Assistant:

explicit basic_bson_encoder(Sink&& sink, 
                                const bson_encode_options& options, 
                                const Allocator& alloc = Allocator())
       : sink_(std::forward<Sink>(sink)),
         options_(options),
         alloc_(alloc)
    {
    }